

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O0

void __thiscall wasm::TranslateToFuzzReader::addHashMemorySupport(TranslateToFuzzReader *this)

{
  Module *pMVar1;
  variant<wasm::Name,_wasm::HeapType> value;
  variant<wasm::Name,_wasm::HeapType> value_00;
  initializer_list<wasm::Type> __l;
  bool bVar2;
  Const *pCVar3;
  reference pvVar4;
  pointer pMVar5;
  address64_t aVar6;
  Builder *this_00;
  LocalGet *pLVar7;
  Binary *pBVar8;
  Load *right;
  Name *pNVar9;
  long lVar10;
  ulong uVar11;
  optional<wasm::Type> type;
  Name name;
  Name NVar12;
  Name NVar13;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 local_1f8;
  string_view local_1f0;
  unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_> local_1e0;
  Name local_1d8;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  string_view local_1b0;
  unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_> local_1a0;
  Name local_198;
  allocator<wasm::Type> local_181;
  Type local_180;
  iterator local_178;
  size_type local_170;
  vector<wasm::Type,_std::allocator<wasm::Type>_> local_168;
  Type local_150;
  Type local_148;
  Signature local_140;
  HeapType local_130;
  char *local_128;
  HeapType HStack_120;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> local_118;
  Name *local_110;
  Function *hasher;
  string_view local_f8;
  undefined1 local_e0 [12];
  Block *local_d0;
  Block *body;
  LocalGet *local_c0;
  size_t local_b8;
  char *pcStack_b0;
  Type local_a8;
  Literal local_a0;
  Address local_88;
  Type local_80;
  Type local_78;
  LocalSet *local_70;
  uint local_64;
  Type TStack_60;
  Index i;
  undefined1 local_58 [8];
  Literal zero;
  LocalSet *local_30;
  undefined1 local_28 [8];
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> contents;
  TranslateToFuzzReader *this_local;
  
  contents.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  bVar2 = oneIn(this,2);
  if (!bVar2) {
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::vector
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)local_28);
    pCVar3 = Builder::makeConst<unsigned_int>(&this->builder,0x1505);
    local_30 = Builder::makeLocalSet(&this->builder,0,(Expression *)pCVar3);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)local_28,
               (value_type *)&local_30);
    pvVar4 = std::
             vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
             ::operator[](&this->wasm->memories,0);
    pMVar5 = std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::operator->(pvVar4);
    TStack_60.id = (pMVar5->addressType).id;
    wasm::Literal::makeFromInt32((Literal *)local_58,0,TStack_60);
    for (local_64 = 0; uVar11 = (ulong)local_64,
        aVar6 = Address::operator_cast_to_unsigned_long
                          (&(this->fuzzParams->super_FuzzParams).USABLE_MEMORY), uVar11 < aVar6;
        local_64 = local_64 + 1) {
      this_00 = &this->builder;
      Type::Type(&local_78,i32);
      pLVar7 = Builder::makeLocalGet(this_00,0,local_78);
      pCVar3 = Builder::makeConst<unsigned_int>(&this->builder,5);
      pBVar8 = Builder::makeBinary(this_00,ShlInt32,(Expression *)pLVar7,(Expression *)pCVar3);
      Type::Type(&local_80,i32);
      pLVar7 = Builder::makeLocalGet(&this->builder,0,local_80);
      pBVar8 = Builder::makeBinary(this_00,AddInt32,(Expression *)pBVar8,(Expression *)pLVar7);
      Address::Address(&local_88,(ulong)local_64);
      ::wasm::Literal::Literal(&local_a0,(Literal *)local_58);
      pCVar3 = Builder::makeConst(&this->builder,&local_a0);
      Type::Type(&local_a8,i32);
      pvVar4 = std::
               vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
               ::operator[](&this->wasm->memories,0);
      pMVar5 = std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::operator->(pvVar4)
      ;
      local_b8 = (pMVar5->super_Importable).super_Named.name.super_IString.str._M_len;
      pcStack_b0 = (pMVar5->super_Importable).super_Named.name.super_IString.str._M_str;
      right = Builder::makeLoad(&this->builder,1,false,local_88,1,(Expression *)pCVar3,local_a8,
                                (Name)(pMVar5->super_Importable).super_Named.name.super_IString.str)
      ;
      pBVar8 = Builder::makeBinary(this_00,XorInt32,(Expression *)pBVar8,(Expression *)right);
      local_70 = Builder::makeLocalSet(this_00,0,(Expression *)pBVar8);
      std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)local_28,
                 (value_type *)&local_70);
      ::wasm::Literal::~Literal(&local_a0);
    }
    Type::Type((Type *)&body,i32);
    local_c0 = Builder::makeLocalGet(&this->builder,0,(Type)body);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)local_28,
               (value_type *)&local_c0);
    std::optional<wasm::Type>::optional((optional<wasm::Type> *)local_e0);
    type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._12_4_ = 0;
    type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)local_e0._0_8_
    ;
    type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._M_engaged = (bool)local_e0[8];
    type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._9_3_ = local_e0._9_3_;
    local_d0 = Builder::
               makeBlock<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_true>
                         (&this->builder,
                          (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                          local_28,type);
    pMVar1 = this->wasm;
    Name::Name((Name *)&hasher,"hashMemory");
    local_f8 = (string_view)Names::getValidFunctionName(pMVar1,(Name)_hasher);
    Name::operator=(&this->hashMemoryName,(Name *)&local_f8);
    pMVar1 = this->wasm;
    local_128 = (char *)(this->hashMemoryName).super_IString.str._M_len;
    HStack_120.id = (uintptr_t)(this->hashMemoryName).super_IString.str._M_str;
    Type::Type(&local_148,none);
    Type::Type(&local_150,i32);
    Signature::Signature(&local_140,local_148,local_150);
    ::wasm::HeapType::HeapType(&local_130,local_140);
    Type::Type(&local_180,i32);
    local_178 = &local_180;
    local_170 = 1;
    std::allocator<wasm::Type>::allocator(&local_181);
    __l._M_len = local_170;
    __l._M_array = local_178;
    std::vector<wasm::Type,_std::allocator<wasm::Type>_>::vector(&local_168,__l,&local_181);
    name.super_IString.str._M_str = local_128;
    name.super_IString.str._M_len = (size_t)&local_118;
    Builder::makeFunction
              (name,HStack_120,(vector<wasm::Type,_std::allocator<wasm::Type>_> *)local_130.id,
               (Expression *)&local_168);
    pNVar9 = (Name *)::wasm::Module::addFunction((unique_ptr *)pMVar1);
    std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::~unique_ptr(&local_118);
    std::vector<wasm::Type,_std::allocator<wasm::Type>_>::~vector(&local_168);
    std::allocator<wasm::Type>::~allocator(&local_181);
    local_110 = pNVar9;
    if ((this->preserveImportsAndExports & 1U) == 0) {
      pMVar1 = this->wasm;
      Name::Name(&local_198,"hashMemory");
      NVar12.super_IString.str._M_str = (char *)local_198.super_IString.str._M_len;
      NVar12.super_IString.str._M_len = (size_t)pMVar1;
      lVar10 = ::wasm::Module::getExportOrNull(NVar12);
      if (lVar10 == 0) {
        pMVar1 = this->wasm;
        Name::Name((Name *)&local_1b0,"hashMemory");
        std::variant<wasm::Name,wasm::HeapType>::variant<wasm::Name&,void,void,wasm::Name,void>
                  ((variant<wasm::Name,wasm::HeapType> *)&local_1c8,local_110);
        value.super__Variant_base<wasm::Name,_wasm::HeapType>.
        super__Move_assign_alias<wasm::Name,_wasm::HeapType>.
        super__Copy_assign_alias<wasm::Name,_wasm::HeapType>.
        super__Move_ctor_alias<wasm::Name,_wasm::HeapType>.
        super__Copy_ctor_alias<wasm::Name,_wasm::HeapType>.
        super__Variant_storage_alias<wasm::Name,_wasm::HeapType>._M_u._M_first._M_storage.
        super_IString.str._M_str = (char *)uStack_1c0;
        value.super__Variant_base<wasm::Name,_wasm::HeapType>.
        super__Move_assign_alias<wasm::Name,_wasm::HeapType>.
        super__Copy_assign_alias<wasm::Name,_wasm::HeapType>.
        super__Move_ctor_alias<wasm::Name,_wasm::HeapType>.
        super__Copy_ctor_alias<wasm::Name,_wasm::HeapType>.
        super__Variant_storage_alias<wasm::Name,_wasm::HeapType>._M_u._M_first._M_storage.
        super_IString.str._M_len = local_1c8;
        value.super__Variant_base<wasm::Name,_wasm::HeapType>.
        super__Move_assign_alias<wasm::Name,_wasm::HeapType>.
        super__Copy_assign_alias<wasm::Name,_wasm::HeapType>.
        super__Move_ctor_alias<wasm::Name,_wasm::HeapType>.
        super__Copy_ctor_alias<wasm::Name,_wasm::HeapType>.
        super__Variant_storage_alias<wasm::Name,_wasm::HeapType>._16_8_ = local_1b8;
        Builder::makeExport((Builder *)&local_1a0,(Name)local_1b0,value,Function);
        ::wasm::Module::addExport((unique_ptr *)pMVar1);
        std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>::~unique_ptr(&local_1a0);
        pMVar1 = this->wasm;
        Name::Name(&local_1d8,"memory");
        NVar13.super_IString.str._M_str = (char *)local_1d8.super_IString.str._M_len;
        NVar13.super_IString.str._M_len = (size_t)pMVar1;
        lVar10 = ::wasm::Module::getExportOrNull(NVar13);
        if (lVar10 == 0) {
          pMVar1 = this->wasm;
          Name::Name((Name *)&local_1f0,"memory");
          pvVar4 = std::
                   vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                   ::operator[](&this->wasm->memories,0);
          pMVar5 = std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::operator->
                             (pvVar4);
          std::variant<wasm::Name,wasm::HeapType>::variant<wasm::Name&,void,void,wasm::Name,void>
                    ((variant<wasm::Name,wasm::HeapType> *)&local_208,(Name *)pMVar5);
          value_00.super__Variant_base<wasm::Name,_wasm::HeapType>.
          super__Move_assign_alias<wasm::Name,_wasm::HeapType>.
          super__Copy_assign_alias<wasm::Name,_wasm::HeapType>.
          super__Move_ctor_alias<wasm::Name,_wasm::HeapType>.
          super__Copy_ctor_alias<wasm::Name,_wasm::HeapType>.
          super__Variant_storage_alias<wasm::Name,_wasm::HeapType>._M_u._M_first._M_storage.
          super_IString.str._M_str = (char *)uStack_200;
          value_00.super__Variant_base<wasm::Name,_wasm::HeapType>.
          super__Move_assign_alias<wasm::Name,_wasm::HeapType>.
          super__Copy_assign_alias<wasm::Name,_wasm::HeapType>.
          super__Move_ctor_alias<wasm::Name,_wasm::HeapType>.
          super__Copy_ctor_alias<wasm::Name,_wasm::HeapType>.
          super__Variant_storage_alias<wasm::Name,_wasm::HeapType>._M_u._M_first._M_storage.
          super_IString.str._M_len = local_208;
          value_00.super__Variant_base<wasm::Name,_wasm::HeapType>.
          super__Move_assign_alias<wasm::Name,_wasm::HeapType>.
          super__Copy_assign_alias<wasm::Name,_wasm::HeapType>.
          super__Move_ctor_alias<wasm::Name,_wasm::HeapType>.
          super__Copy_ctor_alias<wasm::Name,_wasm::HeapType>.
          super__Variant_storage_alias<wasm::Name,_wasm::HeapType>._16_8_ = local_1f8;
          Builder::makeExport((Builder *)&local_1e0,(Name)local_1f0,value_00,Memory);
          ::wasm::Module::addExport((unique_ptr *)pMVar1);
          std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>::~unique_ptr(&local_1e0)
          ;
        }
      }
    }
    ::wasm::Literal::~Literal((Literal *)local_58);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~vector
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)local_28);
  }
  return;
}

Assistant:

void TranslateToFuzzReader::addHashMemorySupport() {
  // Don't always add this.
  if (oneIn(2)) {
    return;
  }

  // Add memory hasher helper (for the hash, see hash.h). The function looks
  // like:
  // function hashMemory() {
  //   hash = 5381;
  //   hash = ((hash << 5) + hash) ^ mem[0];
  //   hash = ((hash << 5) + hash) ^ mem[1];
  //   ..
  //   return hash;
  // }
  std::vector<Expression*> contents;
  contents.push_back(
    builder.makeLocalSet(0, builder.makeConst(uint32_t(5381))));
  auto zero = Literal::makeFromInt32(0, wasm.memories[0]->addressType);
  for (Index i = 0; i < fuzzParams->USABLE_MEMORY; i++) {
    contents.push_back(builder.makeLocalSet(
      0,
      builder.makeBinary(
        XorInt32,
        builder.makeBinary(
          AddInt32,
          builder.makeBinary(ShlInt32,
                             builder.makeLocalGet(0, Type::i32),
                             builder.makeConst(uint32_t(5))),
          builder.makeLocalGet(0, Type::i32)),
        builder.makeLoad(1,
                         false,
                         i,
                         1,
                         builder.makeConst(zero),
                         Type::i32,
                         wasm.memories[0]->name))));
  }
  contents.push_back(builder.makeLocalGet(0, Type::i32));
  auto* body = builder.makeBlock(contents);
  hashMemoryName = Names::getValidFunctionName(wasm, "hashMemory");
  auto* hasher = wasm.addFunction(builder.makeFunction(
    hashMemoryName, Signature(Type::none, Type::i32), {Type::i32}, body));

  if (!preserveImportsAndExports && !wasm.getExportOrNull("hashMemory")) {
    wasm.addExport(
      builder.makeExport("hashMemory", hasher->name, ExternalKind::Function));
    // Export memory so JS fuzzing can use it
    if (!wasm.getExportOrNull("memory")) {
      wasm.addExport(builder.makeExport(
        "memory", wasm.memories[0]->name, ExternalKind::Memory));
    }
  }
}